

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::iterate(CopyImageTest *this)

{
  bool bVar1;
  long *plVar2;
  code *local_170;
  int local_14c;
  undefined1 local_148 [4];
  int method;
  Iteration iterations [6];
  IterationFunc iteration6 [2];
  code *local_c8;
  IterationFunc iteration5 [3];
  code *local_98;
  IterationFunc iteration4 [2];
  code *local_78;
  IterationFunc iteration3 [2];
  code *local_58;
  IterationFunc iteration2 [1];
  code *local_48;
  IterationFunc iteration1 [3];
  CopyImageTest *this_local;
  
  memset(&local_48,0,0x30);
  local_48 = logTestInfoIter;
  iteration1[1] = (IterationFunc)createImagesIter;
  local_58 = renderDestinationIter;
  iteration2[0] = 0;
  local_78 = copyImageIter;
  iteration3[0] = 0;
  iteration3[1] = (IterationFunc)verifySourceIter;
  local_98 = verifyDestinationIter;
  iteration4[0] = 0;
  iteration4[1] = (IterationFunc)destroyImagesIter;
  memset(&local_c8,0,0x30);
  local_c8 = createImagesIter;
  iteration5[1] = (IterationFunc)copyImageIter;
  iterations[5].methods = (IterationFunc *)verifyDestinationIter;
  Iteration::Iteration((Iteration *)local_148,3,(IterationFunc *)&local_48);
  Iteration::Iteration((Iteration *)&iterations[0].methods,1,(IterationFunc *)&local_58);
  Iteration::Iteration((Iteration *)&iterations[1].methods,2,(IterationFunc *)&local_78);
  Iteration::Iteration((Iteration *)&iterations[2].methods,2,(IterationFunc *)&local_98);
  Iteration::Iteration((Iteration *)&iterations[3].methods,3,(IterationFunc *)&local_c8);
  Iteration::Iteration
            ((Iteration *)&iterations[4].methods,2,(IterationFunc *)&iterations[5].methods);
  for (local_14c = 0; local_14c < *(int *)(local_148 + (long)this->m_iteration * 0x10);
      local_14c = local_14c + 1) {
    local_170 = *(code **)(*(long *)(iterations + this->m_iteration) + (long)local_14c * 0x10);
    plVar2 = (long *)((long)&((CopyImageTest *)
                             (&((CopyImageTest *)
                               (&((CopyImageTest *)(&this->m_srcImageInfo + -6))->m_srcImageInfo +
                               -6))->m_srcImageInfo + -6))->m_srcImageInfo +
                     *(long *)(*(long *)(iterations + this->m_iteration) + 8 +
                              (long)local_14c * 0x10) + 0xffffffffffffff88U);
    if (((ulong)local_170 & 1) != 0) {
      local_170 = *(code **)(local_170 + *plVar2 + -1);
    }
    (*local_170)(plVar2);
  }
  this->m_iteration = this->m_iteration + 1;
  bVar1 = 5 < this->m_iteration;
  if (bVar1) {
    tcu::ResultCollector::setTestContextResult
              (&this->m_state->results,
               (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  }
  this_local._4_4_ = (IterateResult)!bVar1;
  return this_local._4_4_;
}

Assistant:

TestCase::IterateResult CopyImageTest::iterate (void)
{
	// Note: Returning from iterate() has two side-effects: it touches
	// watchdog and calls eglSwapBuffers. For the first it's important
	// to keep work per iteration reasonable to avoid
	// timeouts. Because of the latter, it's prudent to do more than
	// trivial amount of work. Otherwise we'll end up waiting for a
	// new buffer in swap, it seems.

	// The split below tries to combine trivial work with actually
	// expensive rendering iterations without having too much
	// rendering in one iteration to avoid timeouts.
	const IterationFunc iteration1[] =
	{
		&CopyImageTest::logTestInfoIter,
		&CopyImageTest::createImagesIter,
		&CopyImageTest::renderSourceIter
	};
	const IterationFunc iteration2[] =
	{
		&CopyImageTest::renderDestinationIter
	};
	const IterationFunc iteration3[] =
	{
		&CopyImageTest::copyImageIter,
		&CopyImageTest::verifySourceIter
	};
	const IterationFunc iteration4[] =
	{
		&CopyImageTest::verifyDestinationIter,
		&CopyImageTest::destroyImagesIter
	};
	const IterationFunc iteration5[] =
	{
		&CopyImageTest::createImagesIter,
		&CopyImageTest::copyImageIter,
		&CopyImageTest::verifySourceIter
	};
	const IterationFunc iteration6[] =
	{
		&CopyImageTest::verifyDestinationIter,
		&CopyImageTest::destroyImagesIter
	};
	const Iteration iterations[] =
	{
		Iteration(DE_LENGTH_OF_ARRAY(iteration1), iteration1),
		Iteration(DE_LENGTH_OF_ARRAY(iteration2), iteration2),
		Iteration(DE_LENGTH_OF_ARRAY(iteration3), iteration3),
		Iteration(DE_LENGTH_OF_ARRAY(iteration4), iteration4),
		Iteration(DE_LENGTH_OF_ARRAY(iteration5), iteration5),
		Iteration(DE_LENGTH_OF_ARRAY(iteration6), iteration6)
	};

	DE_ASSERT(m_iteration < DE_LENGTH_OF_ARRAY(iterations));
	for (int method = 0; method < iterations[m_iteration].methodCount; method++)
		(this->*iterations[m_iteration].methods[method])();

	m_iteration++;

	if (m_iteration < DE_LENGTH_OF_ARRAY(iterations))
	{
		return CONTINUE;
	}
	else
	{
		m_state->results.setTestContextResult(m_testCtx);
		return STOP;
	}
}